

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::ReshapeParameter::InternalSerializeWithCachedSizesToArray
          (ReshapeParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  BlobShape *this_00;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint8 *puVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    this_00 = this->shape_;
    *target = '\n';
    pbVar8 = target + 1;
    uVar6 = this_00->_cached_size_;
    uVar4 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar4;
    target = BlobShape::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar8 + 1);
  }
  if ((uVar1 & 2) != 0) {
    uVar7 = (ulong)this->axis_;
    pbVar8 = target + 1;
    *target = 0x10;
    uVar9 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar9 = uVar7 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar9;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar9;
    target = pbVar8 + 1;
  }
  if ((uVar1 & 4) != 0) {
    uVar7 = (ulong)this->num_axes_;
    pbVar8 = target + 1;
    *target = 0x18;
    uVar9 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar9 = uVar7 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar9;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar9;
    target = pbVar8 + 1;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ReshapeParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ReshapeParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.BlobShape shape = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->shape_, deterministic, target);
  }

  // optional int32 axis = 2 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->axis(), target);
  }

  // optional int32 num_axes = 3 [default = -1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->num_axes(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ReshapeParameter)
  return target;
}